

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O2

void vkt::shaderexecutor::anon_unknown_0::declareUniformIndexVars
               (ostream *str,deUint32 bindingLocation,char *varPrefix,int numVars)

{
  ostream *poVar1;
  int iVar2;
  int iVar3;
  
  poVar1 = std::operator<<(str,"layout(set = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1);
  poVar1 = std::operator<<(poVar1,", binding = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", std140) uniform Indices\n{\n");
  iVar3 = 0;
  iVar2 = (int)varPrefix;
  if ((int)varPrefix < 1) {
    iVar2 = iVar3;
  }
  for (; iVar2 != iVar3; iVar3 = iVar3 + 1) {
    poVar1 = std::operator<<(str,"\thighp int ");
    poVar1 = std::operator<<(poVar1,"index");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<(str,"};\n");
  return;
}

Assistant:

static void declareUniformIndexVars (std::ostream& str, deUint32 bindingLocation, const char* varPrefix, int numVars)
{
	str << "layout(set = " << EXTRA_RESOURCES_DESCRIPTOR_SET_INDEX << ", binding = " << bindingLocation << ", std140) uniform Indices\n{\n";

	for (int varNdx = 0; varNdx < numVars; varNdx++)
		str << "\thighp int " << varPrefix << varNdx << ";\n";

	str << "};\n";
}